

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O1

void dlfree(void *mem)

{
  ulong uVar1;
  ulong uVar2;
  mchunkptr pmVar3;
  bool bVar4;
  int iVar5;
  undefined8 in_RAX;
  malloc_tree_chunk **ppmVar6;
  malloc_tree_chunk *pmVar7;
  mstate pmVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  mstate pmVar12;
  tchunkptr TP;
  mstate pmVar13;
  long lVar14;
  malloc_tree_chunk *pmVar15;
  char *pcVar16;
  mstate pmVar17;
  ulong uVar18;
  int local_24;
  
  if (mem == (void *)0x0) {
    return;
  }
  pmVar13 = (mstate)((long)mem - 0x10);
  if ((pmVar13 < _gm_.least_addr) || (uVar1 = *(ulong *)((long)mem + -8), ((uint)uVar1 & 3) == 1))
  goto LAB_00104d1d;
  uVar18 = uVar1 & 0xfffffffffffffff8;
  pmVar12 = (mstate)((long)pmVar13->smallbins + (uVar18 - 0x48));
  if ((uVar1 & 1) == 0) {
    uVar2 = *(ulong *)pmVar13;
    if ((uVar1 & 2) == 0) {
      uVar18 = uVar18 + uVar2 + 0x20;
      iVar5 = munmap((void *)((long)pmVar13 - uVar2),uVar18);
      local_24 = 2;
      if (iVar5 == 0) {
        _gm_.footprint = _gm_.footprint - uVar18;
      }
    }
    else {
      pmVar13 = (mstate)((long)pmVar13 - uVar2);
      uVar18 = uVar18 + uVar2;
      if (_gm_.least_addr <= pmVar13) {
        if (pmVar13 == (mstate)_gm_.dv) {
          if ((~(uint)pmVar12->dvsize & 3) == 0) {
            _gm_.dvsize = uVar18;
            pmVar12->dvsize = pmVar12->dvsize & 0xfffffffffffffffe;
            pmVar13->dvsize = uVar18 | 1;
            *(ulong *)pmVar12 = uVar18;
            local_24 = 2;
            goto LAB_00104783;
          }
        }
        else {
          if (0xff < uVar2) {
            pmVar8 = (mstate)pmVar13->least_addr;
            pmVar7 = (malloc_tree_chunk *)pmVar13->trim_check;
            if (pmVar8 == pmVar13) {
              pmVar8 = (mstate)pmVar13->top;
              if (pmVar8 != (mstate)0x0) {
                ppmVar6 = (malloc_tree_chunk **)&pmVar13->top;
LAB_001047ee:
                do {
                  if (pmVar8->top == (mchunkptr)0x0) {
                    if ((malloc_tree_chunk *)pmVar8->dv == (malloc_tree_chunk *)0x0)
                    goto code_r0x00104802;
                    ppmVar6 = (malloc_tree_chunk **)&pmVar8->dv;
                  }
                  else {
                    ppmVar6 = (malloc_tree_chunk **)&pmVar8->top;
                  }
                  pmVar8 = (mstate)*ppmVar6;
                } while( true );
              }
              pmVar8 = (mstate)pmVar13->dv;
              if (pmVar8 != (mstate)0x0) {
                ppmVar6 = (malloc_tree_chunk **)&pmVar13->dv;
                goto LAB_001047ee;
              }
              pmVar8 = (mstate)0x0;
            }
            else {
              pmVar15 = (malloc_tree_chunk *)pmVar13->topsize;
              if (((pmVar15 < _gm_.least_addr) || ((mstate)pmVar15->bk != pmVar13)) ||
                 ((mstate)pmVar8->topsize != pmVar13)) goto LAB_00104d1d;
              pmVar15->bk = (malloc_tree_chunk *)pmVar8;
              pmVar8->topsize = (size_t)pmVar15;
            }
            goto LAB_00104812;
          }
          pmVar7 = (malloc_tree_chunk *)pmVar13->topsize;
          pmVar15 = (malloc_tree_chunk *)pmVar13->least_addr;
          if ((pmVar7 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar2 >> 3) * 2)) &&
             ((pmVar7 < _gm_.least_addr || ((mstate)pmVar7->bk != pmVar13)))) goto LAB_00104d1d;
          if (pmVar15 == pmVar7) {
            dlfree_cold_1();
          }
          else {
            if ((pmVar15 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar2 >> 3) * 2)) &&
               ((pmVar15 < _gm_.least_addr || ((mstate)pmVar15->fd != pmVar13)))) goto LAB_00104d1d;
            pmVar7->bk = pmVar15;
            pmVar15->fd = pmVar7;
          }
        }
        bVar4 = true;
        local_24 = 0;
        goto LAB_001048c4;
      }
      local_24 = 5;
    }
LAB_00104783:
    bVar4 = false;
    goto LAB_001048c4;
  }
LAB_001048cc:
  local_24 = 0;
  if ((pmVar13 < pmVar12) && (uVar1 = pmVar12->dvsize, (uVar1 & 1) != 0)) {
    if ((uVar1 & 2) != 0) {
      pmVar12->dvsize = uVar1 & 0xfffffffffffffffe;
      pmVar13->dvsize = uVar18 | 1;
      *(ulong *)((long)pmVar13->smallbins + (uVar18 - 0x48)) = uVar18;
      goto LAB_00104b21;
    }
    if (pmVar12 == (mstate)_gm_.top) {
      dlfree_cold_2();
      local_24 = (int)((ulong)in_RAX >> 0x20);
      goto LAB_00104cd7;
    }
    if (pmVar12 != (mstate)_gm_.dv) {
      if (0xff < uVar1) {
        pmVar8 = (mstate)pmVar12->least_addr;
        pmVar7 = (malloc_tree_chunk *)pmVar12->trim_check;
        if (pmVar8 == pmVar12) {
          pmVar8 = (mstate)pmVar12->top;
          if (pmVar8 != (mstate)0x0) {
            ppmVar6 = (malloc_tree_chunk **)&pmVar12->top;
LAB_00104a1c:
            do {
              if (pmVar8->top == (mchunkptr)0x0) {
                if ((malloc_tree_chunk *)pmVar8->dv == (malloc_tree_chunk *)0x0)
                goto code_r0x00104a30;
                ppmVar6 = (malloc_tree_chunk **)&pmVar8->dv;
              }
              else {
                ppmVar6 = (malloc_tree_chunk **)&pmVar8->top;
              }
              pmVar8 = (mstate)*ppmVar6;
            } while( true );
          }
          pmVar8 = (mstate)pmVar12->dv;
          if (pmVar8 != (mstate)0x0) {
            ppmVar6 = (malloc_tree_chunk **)&pmVar12->dv;
            goto LAB_00104a1c;
          }
          pmVar8 = (mstate)0x0;
        }
        else {
          pmVar15 = (malloc_tree_chunk *)pmVar12->topsize;
          if (((pmVar15 < _gm_.least_addr) || ((mstate)pmVar15->bk != pmVar12)) ||
             ((mstate)pmVar8->topsize != pmVar12)) goto LAB_00104d1d;
          pmVar15->bk = (malloc_tree_chunk *)pmVar8;
          pmVar8->topsize = (size_t)pmVar15;
        }
        goto LAB_00104a44;
      }
      pmVar7 = (malloc_tree_chunk *)pmVar12->topsize;
      pmVar15 = (malloc_tree_chunk *)pmVar12->least_addr;
      if ((pmVar7 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar1 >> 3) * 2)) &&
         ((pmVar7 < _gm_.least_addr || ((mstate)pmVar7->bk != pmVar12)))) goto LAB_00104d1d;
      if (pmVar15 == pmVar7) {
        bVar9 = (byte)(uVar1 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
      }
      else {
        if ((pmVar15 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar1 >> 3) * 2)) &&
           ((pmVar15 < _gm_.least_addr || ((mstate)pmVar15->fd != pmVar12)))) goto LAB_00104d1d;
        pmVar7->bk = pmVar15;
        pmVar15->fd = pmVar7;
      }
      goto LAB_00104ae8;
    }
    dlfree_cold_3();
LAB_00104bba:
    local_24 = 2;
  }
LAB_00104cd7:
  if (local_24 == 2) {
    return;
  }
LAB_00104d1d:
  abort();
code_r0x00104802:
  if (ppmVar6 < _gm_.least_addr) goto LAB_00104d1d;
  *ppmVar6 = (malloc_tree_chunk *)0x0;
LAB_00104812:
  iVar5 = 0;
  bVar4 = true;
  local_24 = 0;
  if (pmVar7 != (malloc_tree_chunk *)0x0) {
    uVar11 = (uint)pmVar13->release_checks;
    local_24 = iVar5;
    if (pmVar13 == (mstate)_gm_.treebins[uVar11]) {
      _gm_.treebins[uVar11] = (tbinptr)pmVar8;
      if (pmVar8 == (mstate)0x0) {
        bVar9 = (byte)uVar11 & 0x1f;
        _gm_.treemap = _gm_.treemap & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
        goto LAB_0010486c;
      }
    }
    else {
      if (pmVar7 < _gm_.least_addr) goto LAB_00104d1d;
      if ((mstate)pmVar7->child[0] == pmVar13) {
        pmVar7->child[0] = (malloc_tree_chunk *)pmVar8;
      }
      else {
        pmVar7->child[1] = (malloc_tree_chunk *)pmVar8;
      }
LAB_0010486c:
      if (pmVar8 == (mstate)0x0) goto LAB_001048c4;
    }
    pcVar16 = _gm_.least_addr;
    if (pmVar8 < _gm_.least_addr) goto LAB_00104d1d;
    pmVar8->trim_check = (size_t)pmVar7;
    pmVar7 = (malloc_tree_chunk *)pmVar13->dv;
    if (pmVar7 != (malloc_tree_chunk *)0x0) {
      if (pmVar7 < pcVar16) goto LAB_00104d1d;
      pmVar8->dv = (mchunkptr)pmVar7;
      pmVar7->parent = (malloc_tree_chunk *)pmVar8;
    }
    pmVar3 = pmVar13->top;
    if (pmVar3 != (mchunkptr)0x0) {
      if (pmVar3 < pcVar16) goto LAB_00104d1d;
      pmVar8->top = pmVar3;
      pmVar3[1].fd = (malloc_chunk *)pmVar8;
    }
  }
LAB_001048c4:
  if (bVar4) goto LAB_001048cc;
  goto LAB_00104cd7;
code_r0x00104a30:
  if (ppmVar6 < _gm_.least_addr) goto LAB_00104d1d;
  *ppmVar6 = (malloc_tree_chunk *)0x0;
LAB_00104a44:
  if (pmVar7 != (malloc_tree_chunk *)0x0) {
    uVar11 = (uint)pmVar12->release_checks;
    if (pmVar12 == (mstate)_gm_.treebins[uVar11]) {
      _gm_.treebins[uVar11] = (tbinptr)pmVar8;
      if (pmVar8 == (mstate)0x0) {
        bVar9 = (byte)uVar11 & 0x1f;
        _gm_.treemap = _gm_.treemap & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
        goto LAB_00104a9b;
      }
    }
    else {
      if (pmVar7 < _gm_.least_addr) goto LAB_00104d1d;
      if ((mstate)pmVar7->child[0] == pmVar12) {
        pmVar7->child[0] = (malloc_tree_chunk *)pmVar8;
      }
      else {
        pmVar7->child[1] = (malloc_tree_chunk *)pmVar8;
      }
LAB_00104a9b:
      if (pmVar8 == (mstate)0x0) goto LAB_00104ae8;
    }
    pcVar16 = _gm_.least_addr;
    if (pmVar8 < _gm_.least_addr) goto LAB_00104d1d;
    pmVar8->trim_check = (size_t)pmVar7;
    pmVar7 = (malloc_tree_chunk *)pmVar12->dv;
    if (pmVar7 != (malloc_tree_chunk *)0x0) {
      if (pmVar7 < pcVar16) goto LAB_00104d1d;
      pmVar8->dv = (mchunkptr)pmVar7;
      pmVar7->parent = (malloc_tree_chunk *)pmVar8;
    }
    pmVar3 = pmVar12->top;
    if (pmVar3 != (mchunkptr)0x0) {
      if (pmVar3 < pcVar16) goto LAB_00104d1d;
      pmVar8->top = pmVar3;
      pmVar3[1].fd = (malloc_chunk *)pmVar8;
    }
  }
LAB_00104ae8:
  uVar18 = (uVar1 & 0xfffffffffffffff8) + uVar18;
  pmVar13->dvsize = uVar18 | 1;
  *(ulong *)((long)pmVar13->smallbins + (uVar18 - 0x48)) = uVar18;
  if (pmVar13 == (mstate)_gm_.dv) {
    local_24 = 2;
    _gm_.dvsize = uVar18;
  }
  else {
LAB_00104b21:
    if (uVar18 < 0x100) {
      uVar18 = uVar18 >> 3;
      if ((_gm_.smallmap >> ((uint)uVar18 & 0x1f) & 1) == 0) {
        _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar18 & 0x1f);
        pmVar7 = (malloc_tree_chunk *)(_gm_.smallbins + uVar18 * 2);
      }
      else {
        pmVar7 = (malloc_tree_chunk *)_gm_.smallbins[uVar18 * 2 + 2];
        if ((malloc_tree_chunk *)_gm_.smallbins[uVar18 * 2 + 2] < _gm_.least_addr)
        goto LAB_00104d1d;
      }
      _gm_.smallbins[uVar18 * 2 + 2] = (mchunkptr)pmVar13;
      pmVar7->bk = (malloc_tree_chunk *)pmVar13;
      pmVar13->topsize = (size_t)pmVar7;
      pmVar13->least_addr = (char *)(_gm_.smallbins + uVar18 * 2);
      goto LAB_00104bba;
    }
    uVar11 = (uint)(uVar18 >> 8);
    if (uVar11 == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0x1f;
      if (uVar11 < 0x10000) {
        uVar10 = 0x1f;
        if (uVar11 != 0) {
          for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
        }
        uVar10 = (uint)((uVar18 >> ((ulong)(byte)(0x26 - (char)(uVar10 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar10 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    pmVar7 = (malloc_tree_chunk *)(_gm_.treebins + uVar10);
    *(uint *)&pmVar13->release_checks = uVar10;
    pmVar13->dv = (mchunkptr)0x0;
    pmVar13->top = (mchunkptr)0x0;
    if ((_gm_.treemap >> (uVar10 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar10 & 0x1f);
      lVar14 = 0x10;
      pmVar17 = (mstate)&DAT_00000030;
      pmVar12 = pmVar13;
      pmVar15 = pmVar7;
      pmVar8 = pmVar13;
LAB_00104cb5:
      pmVar15->prev_foot = (size_t)pmVar13;
      *(malloc_tree_chunk **)
       ((long)(((malloc_state *)(((malloc_state *)(pmVar17->smallbins + -9))->smallbins + -9))->
               smallbins + 0xfffffffffffffff7) +
       (long)((malloc_state *)
             (((malloc_state *)(((malloc_state *)(pmVar13->smallbins + -9))->smallbins + -9))->
              smallbins + -9))->smallbins + 0xffffffffffffffb8U) = pmVar7;
      pmVar13->least_addr = (char *)pmVar12;
      *(mstate *)((long)pmVar13->smallbins + lVar14 + -0x48) = pmVar8;
      pmVar12 = pmVar17;
    }
    else {
      pmVar12 = (mstate)pmVar7->prev_foot;
      bVar9 = 0x39 - (char)(uVar10 >> 1);
      if (uVar10 == 0x1f) {
        bVar9 = 0;
      }
      lVar14 = uVar18 << (bVar9 & 0x3f);
      do {
        if ((pmVar12->dvsize & 0xfffffffffffffff8) == uVar18) {
          if ((pmVar12 < _gm_.least_addr) ||
             (pmVar7 = (malloc_tree_chunk *)pmVar12->topsize, pmVar7 < _gm_.least_addr))
          goto LAB_00104d1d;
          pmVar7->bk = (malloc_tree_chunk *)pmVar13;
          lVar14 = 0x30;
          pmVar17 = (mstate)&DAT_00000010;
          pmVar15 = (malloc_tree_chunk *)&pmVar12->topsize;
          pmVar8 = (mstate)0x0;
          goto LAB_00104cb5;
        }
        pmVar8 = *(mstate *)((long)pmVar12 + (lVar14 >> 0x3f) * -8 + 0x20);
        pmVar17 = pmVar8;
        if (pmVar8 == (mstate)0x0) {
          pcVar16 = (char *)((long)pmVar12 + (lVar14 >> 0x3f) * -8 + 0x20);
          if (pcVar16 < _gm_.least_addr) goto LAB_00104d1d;
          *(mstate *)pcVar16 = pmVar13;
          pmVar13->trim_check = (size_t)pmVar12;
          pmVar13->least_addr = (char *)pmVar13;
          pmVar13->topsize = (size_t)pmVar13;
          pmVar17 = pmVar12;
        }
        pmVar12 = pmVar17;
        lVar14 = lVar14 * 2;
      } while (pmVar8 != (mstate)0x0);
    }
    _gm_.release_checks = _gm_.release_checks - 1;
    local_24 = 2;
    if (_gm_.release_checks == 0) {
      release_unused_segments(pmVar12);
    }
  }
  goto LAB_00104cd7;
}

Assistant:

void dlfree(void* mem) {
  /*
     Consolidate freed chunks with preceeding or succeeding bordering
     free chunks, if they exist, and then place in a bin.  Intermixed
     with special cases for top, dv, mmapped chunks, and usage errors.
  */

  if (mem != 0) {
    mchunkptr p  = mem2chunk(mem);
#if FOOTERS
    mstate fm = get_mstate_for(p);
    if (!ok_magic(fm)) {
      USAGE_ERROR_ACTION(fm, p);
      return;
    }
#else /* FOOTERS */
#define fm gm
#endif /* FOOTERS */
    if (!PREACTION(fm)) {
      check_inuse_chunk(fm, p);
      if (RTCHECK(ok_address(fm, p) && ok_inuse(p))) {
        size_t psize = chunksize(p);
        mchunkptr next = chunk_plus_offset(p, psize);
        if (!pinuse(p)) {
          size_t prevsize = p->prev_foot;
          if (is_mmapped(p)) {
            psize += prevsize + MMAP_FOOT_PAD;
            if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
              fm->footprint -= psize;
            goto postaction;
          }
          else {
            mchunkptr prev = chunk_minus_offset(p, prevsize);
            psize += prevsize;
            p = prev;
            if (RTCHECK(ok_address(fm, prev))) { /* consolidate backward */
              if (p != fm->dv) {
                unlink_chunk(fm, p, prevsize);
              }
              else if ((next->head & INUSE_BITS) == INUSE_BITS) {
                fm->dvsize = psize;
                set_free_with_pinuse(p, psize, next);
                goto postaction;
              }
            }
            else
              goto erroraction;
          }
        }

        if (RTCHECK(ok_next(p, next) && ok_pinuse(next))) {
          if (!cinuse(next)) {  /* consolidate forward */
            if (next == fm->top) {
              size_t tsize = fm->topsize += psize;
              fm->top = p;
              p->head = tsize | PINUSE_BIT;
              if (p == fm->dv) {
                fm->dv = 0;
                fm->dvsize = 0;
              }
              if (should_trim(fm, tsize))
                sys_trim(fm, 0);
              goto postaction;
            }
            else if (next == fm->dv) {
              size_t dsize = fm->dvsize += psize;
              fm->dv = p;
              set_size_and_pinuse_of_free_chunk(p, dsize);
              goto postaction;
            }
            else {
              size_t nsize = chunksize(next);
              psize += nsize;
              unlink_chunk(fm, next, nsize);
              set_size_and_pinuse_of_free_chunk(p, psize);
              if (p == fm->dv) {
                fm->dvsize = psize;
                goto postaction;
              }
            }
          }
          else
            set_free_with_pinuse(p, psize, next);

          if (is_small(psize)) {
            insert_small_chunk(fm, p, psize);
            check_free_chunk(fm, p);
          }
          else {
            tchunkptr tp = (tchunkptr)p;
            insert_large_chunk(fm, tp, psize);
            check_free_chunk(fm, p);
            if (--fm->release_checks == 0)
              release_unused_segments(fm);
          }
          goto postaction;
        }
      }
    erroraction:
      USAGE_ERROR_ACTION(fm, p);
    postaction:
      POSTACTION(fm);
    }
  }
#if !FOOTERS
#undef fm
#endif /* FOOTERS */
}